

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _d,int _c,
                  Allocator *_allocator)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  int _w_00;
  long lVar8;
  size_t sVar9;
  void *__dest;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  Mat local_78;
  
  iVar1 = this->w;
  iVar2 = this->h;
  iVar3 = this->d;
  iVar4 = this->c;
  _w_00 = iVar3 * iVar4 * iVar2 * iVar1;
  if (_w_00 == _d * _c * _h * _w) {
    iVar5 = this->dims;
    if (iVar5 < 3) {
      lVar8 = (long)_h * (long)_w * (long)_d;
      sVar9 = this->elemsize;
      if (lVar8 - (sVar9 * lVar8 + 0xf & 0xfffffffffffffff0) / sVar9 != 0) {
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->d = 0;
        __return_storage_ptr__->c = 0;
        create(__return_storage_ptr__,_w,_h,_d,_c,sVar9,this->elempack,_allocator);
        __dest = __return_storage_ptr__->data;
        if (__dest == (void *)0x0) {
          return __return_storage_ptr__;
        }
        sVar9 = __return_storage_ptr__->cstep;
        if ((long)__return_storage_ptr__->c * sVar9 == 0) {
          return __return_storage_ptr__;
        }
        lVar10 = 0;
        if (_c < 1) {
          _c = 0;
        }
        uVar11 = (ulong)(uint)_c;
        sVar7 = __return_storage_ptr__->elemsize;
        while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
          memcpy(__dest,(void *)(lVar10 * this->elemsize + (long)this->data),this->elemsize * lVar8)
          ;
          __dest = (void *)((long)__dest + sVar9 * sVar7);
          lVar10 = lVar10 + lVar8;
        }
        return __return_storage_ptr__;
      }
    }
    else {
      if (iVar4 != _c) {
        reshape(&local_78,this,_w_00,_allocator);
        reshape(__return_storage_ptr__,&local_78,_w,_h,_d,_c,_allocator);
        if (local_78.refcount == (int *)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount != 0) {
          return __return_storage_ptr__;
        }
        if (local_78.allocator != (Allocator *)0x0) {
          (*(local_78.allocator)->_vptr_Allocator[3])();
          return __return_storage_ptr__;
        }
        free(local_78.data);
        return __return_storage_ptr__;
      }
      sVar9 = this->elemsize;
    }
    __return_storage_ptr__->data = this->data;
    piVar6 = this->refcount;
    __return_storage_ptr__->refcount = piVar6;
    __return_storage_ptr__->elemsize = sVar9;
    __return_storage_ptr__->elempack = this->elempack;
    __return_storage_ptr__->allocator = this->allocator;
    __return_storage_ptr__->dims = iVar5;
    __return_storage_ptr__->w = iVar1;
    __return_storage_ptr__->h = iVar2;
    __return_storage_ptr__->d = iVar3;
    __return_storage_ptr__->c = iVar4;
    __return_storage_ptr__->cstep = this->cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
      sVar9 = this->elemsize;
    }
    __return_storage_ptr__->dims = 4;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->d = _d;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep =
         ((long)_h * (long)_w * (long)_d * sVar9 + 0xf & 0xfffffffffffffff0) / sVar9;
  }
  else {
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _d, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _d * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h * _d != alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _d, _c, elemsize, elempack, _allocator);
            if (m.empty())
                return m;

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * _d * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * _d * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _d * _c, _allocator);
        return tmp.reshape(_w, _h, _d, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 4;
    m.w = _w;
    m.h = _h;
    m.d = _d;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize;

    return m;
}